

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  int iVar1;
  void *pvVar2;
  bool bVar3;
  LSTMParams *pLVar4;
  long lVar5;
  undefined1 *from;
  InternalMetadata *pIVar6;
  undefined1 *puVar7;
  Result *_result;
  allocator<char> local_192;
  allocator<char> local_191;
  uint64_t local_190;
  string local_188;
  string local_168;
  Type *local_148;
  Type *local_140;
  uint64_t local_138;
  uint64_t local_130;
  string err;
  LSTMParams lstmParams;
  string local_e8;
  BiDirectionalLSTMLayerParams recurrent;
  LSTMParams local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,5);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,5,5);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"BiDirectionalLSTM",(allocator<char> *)&recurrent);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_e8,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_e8);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&recurrent,"BiDirectionalLSTM",(allocator<char> *)&lstmParams);
    validateRankCount(__return_storage_ptr__,layer,(string *)&recurrent,5,5,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&recurrent);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar7 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar7 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar6 = &(((BatchnormLayerParams *)puVar7)->mean_->super_MessageLite)._internal_metadata_;
  if (((BatchnormLayerParams *)puVar7)->mean_ == (WeightParams *)0x0) {
    pIVar6 = (InternalMetadata *)0x0;
  }
  iVar1 = *(int *)&(((ConvolutionLayerParams *)puVar7)->kernelsize_).arena_or_elements_;
  for (lVar5 = 0; (long)iVar1 * 8 != lVar5; lVar5 = lVar5 + 8) {
    validateRecurrentActivationParams
              (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar6->ptr_ + lVar5));
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar7 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar7 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar6 = &(((GRULayerParams *)puVar7)->outputgateweightmatrix_->super_MessageLite).
            _internal_metadata_;
  if (((GRULayerParams *)puVar7)->outputgateweightmatrix_ == (WeightParams *)0x0) {
    pIVar6 = (InternalMetadata *)0x0;
  }
  iVar1 = *(int *)&(((ConvolutionLayerParams *)puVar7)->stride_).arena_or_elements_;
  for (lVar5 = 0; (long)iVar1 * 8 != lVar5; lVar5 = lVar5 + 8) {
    validateRecurrentActivationParams
              (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar6->ptr_ + lVar5));
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar7 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar7 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  from = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar7)->params_;
  puVar7 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar7)->weightparams_;
  if ((LSTMWeightParams *)puVar7 == (LSTMWeightParams *)0x0) {
    puVar7 = Specification::_LSTMWeightParams_default_instance_;
  }
  if ((LSTMParams *)from == (LSTMParams *)0x0) {
    from = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,(LSTMParams *)from);
  validateLSTMWeightParams(__return_storage_ptr__,(LSTMWeightParams *)puVar7,&local_50);
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (layer->_oneof_case_[0] == 0x1ae) {
    puVar7 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar7 = Specification::_BiDirectionalLSTMLayerParams_default_instance_;
  }
  Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
            (&recurrent,(BiDirectionalLSTMLayerParams *)puVar7);
  pLVar4 = recurrent.params_;
  if (recurrent.params_ == (LSTMParams *)0x0) {
    pLVar4 = (LSTMParams *)Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&lstmParams,pLVar4);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if (recurrent.activationsforwardlstm_.super_RepeatedPtrFieldBase.current_size_ == 3) {
    if (recurrent.activationsbackwardlstm_.super_RepeatedPtrFieldBase.current_size_ == 3) {
      local_138 = recurrent.inputvectorsize_;
      local_190 = recurrent.outputvectorsize_;
      local_140 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                            (&recurrent.weightparams_.super_RepeatedPtrFieldBase,0);
      local_148 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                            (&recurrent.weightparams_.super_RepeatedPtrFieldBase,1);
      puVar7 = (undefined1 *)local_140->inputgateweightmatrix_;
      if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
        puVar7 = Specification::_WeightParams_default_instance_;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Bidirectional LSTM",&local_191);
      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"forward input gate weight matrix",&local_192);
      local_138 = local_138 * local_190;
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar7,local_138,local_190,&local_188,
                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        std::__cxx11::string::~string((string *)this_00);
        puVar7 = (undefined1 *)local_140->forgetgateweightmatrix_;
        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
          puVar7 = Specification::_WeightParams_default_instance_;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"Bidirectional LSTM",&local_191);
        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"forward forget gate weight matrix",&local_192);
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar7,local_138,local_190,&local_188,
                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        bVar3 = Result::good(__return_storage_ptr__);
        if (bVar3) {
          std::__cxx11::string::~string((string *)this_00);
          puVar7 = (undefined1 *)local_140->blockinputweightmatrix_;
          if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
            puVar7 = Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,"Bidirectional LSTM",&local_191);
          pvVar2 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_168,"forward block input gate weight matrix",&local_192);
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar7,local_138,local_190,&local_188,
                     (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          bVar3 = Result::good(__return_storage_ptr__);
          if (bVar3) {
            std::__cxx11::string::~string((string *)this_00);
            puVar7 = (undefined1 *)local_140->outputgateweightmatrix_;
            if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
              puVar7 = Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"Bidirectional LSTM",&local_191);
            pvVar2 = (layer->name_).tagged_ptr_.ptr_;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"forward output gate weight matrix",&local_192);
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar7,local_138,local_190,&local_188,
                       (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_188);
            bVar3 = Result::good(__return_storage_ptr__);
            if (bVar3) {
              std::__cxx11::string::~string((string *)this_00);
              puVar7 = (undefined1 *)local_140->inputgaterecursionmatrix_;
              if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                puVar7 = Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_188,"Bidirectional LSTM",&local_191);
              pvVar2 = (layer->name_).tagged_ptr_.ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_168,"forward input gate recursion matrix",&local_192);
              local_130 = local_190 * local_190;
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar7,local_130,local_190,
                         &local_188,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
              std::__cxx11::string::~string((string *)&local_168);
              std::__cxx11::string::~string((string *)&local_188);
              bVar3 = Result::good(__return_storage_ptr__);
              if (bVar3) {
                std::__cxx11::string::~string((string *)this_00);
                puVar7 = (undefined1 *)local_140->forgetgaterecursionmatrix_;
                if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                  puVar7 = Specification::_WeightParams_default_instance_;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_188,"Bidirectional LSTM",&local_191);
                pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_168,"forward forget gate recursion matrix",&local_192);
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar7,local_130,local_190,
                           &local_188,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
                std::__cxx11::string::~string((string *)&local_168);
                std::__cxx11::string::~string((string *)&local_188);
                bVar3 = Result::good(__return_storage_ptr__);
                if (bVar3) {
                  std::__cxx11::string::~string((string *)this_00);
                  puVar7 = (undefined1 *)local_140->blockinputrecursionmatrix_;
                  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                    puVar7 = Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_188,"Bidirectional LSTM",&local_191);
                  pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_168,"forward block input gate recursion matrix",
                             &local_192);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar7,local_130,local_190,
                             &local_188,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
                  std::__cxx11::string::~string((string *)&local_168);
                  std::__cxx11::string::~string((string *)&local_188);
                  bVar3 = Result::good(__return_storage_ptr__);
                  if (bVar3) {
                    std::__cxx11::string::~string((string *)this_00);
                    puVar7 = (undefined1 *)local_140->outputgaterecursionmatrix_;
                    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                      puVar7 = Specification::_WeightParams_default_instance_;
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_188,"Bidirectional LSTM",&local_191);
                    pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_168,"forward output gate recursion matrix",
                               &local_192);
                    validateGeneralWeightParams
                              (__return_storage_ptr__,(WeightParams *)puVar7,local_130,local_190,
                               &local_188,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168)
                    ;
                    std::__cxx11::string::~string((string *)&local_168);
                    std::__cxx11::string::~string((string *)&local_188);
                    bVar3 = Result::good(__return_storage_ptr__);
                    if (bVar3) {
                      std::__cxx11::string::~string((string *)this_00);
                      puVar7 = (undefined1 *)local_148->inputgateweightmatrix_;
                      if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                        puVar7 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_188,"Bidirectional LSTM",&local_191);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_168,"backward input gate weight matrix",&local_192
                                );
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar7,local_138,local_190,
                                 &local_188,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                 &local_168);
                      std::__cxx11::string::~string((string *)&local_168);
                      std::__cxx11::string::~string((string *)&local_188);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (bVar3) {
                        std::__cxx11::string::~string((string *)this_00);
                        puVar7 = (undefined1 *)local_148->forgetgateweightmatrix_;
                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                          puVar7 = Specification::_WeightParams_default_instance_;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_188,"Bidirectional LSTM",&local_191);
                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_168,"backward forget gate weight matrix",
                                   &local_192);
                        validateGeneralWeightParams
                                  (__return_storage_ptr__,(WeightParams *)puVar7,local_138,local_190
                                   ,&local_188,(string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                   &local_168);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_188);
                        bVar3 = Result::good(__return_storage_ptr__);
                        if (bVar3) {
                          std::__cxx11::string::~string((string *)this_00);
                          puVar7 = (undefined1 *)local_148->blockinputweightmatrix_;
                          if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                            puVar7 = Specification::_WeightParams_default_instance_;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_188,"Bidirectional LSTM",&local_191);
                          pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_168,"backward block input gate weight matrix",
                                     &local_192);
                          validateGeneralWeightParams
                                    (__return_storage_ptr__,(WeightParams *)puVar7,local_138,
                                     local_190,&local_188,
                                     (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
                          std::__cxx11::string::~string((string *)&local_168);
                          std::__cxx11::string::~string((string *)&local_188);
                          bVar3 = Result::good(__return_storage_ptr__);
                          if (bVar3) {
                            std::__cxx11::string::~string((string *)this_00);
                            puVar7 = (undefined1 *)local_148->outputgateweightmatrix_;
                            if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                              puVar7 = Specification::_WeightParams_default_instance_;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_188,"Bidirectional LSTM",&local_191);
                            pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_168,"backward output gate weight matrix",
                                       &local_192);
                            validateGeneralWeightParams
                                      (__return_storage_ptr__,(WeightParams *)puVar7,local_138,
                                       local_190,&local_188,
                                       (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
                            std::__cxx11::string::~string((string *)&local_168);
                            std::__cxx11::string::~string((string *)&local_188);
                            bVar3 = Result::good(__return_storage_ptr__);
                            if (bVar3) {
                              std::__cxx11::string::~string((string *)this_00);
                              puVar7 = (undefined1 *)local_148->inputgaterecursionmatrix_;
                              if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                puVar7 = Specification::_WeightParams_default_instance_;
                              }
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_188,"Bidirectional LSTM",&local_191);
                              pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_168,"backward input gate recursion matrix"
                                         ,&local_192);
                              validateGeneralWeightParams
                                        (__return_storage_ptr__,(WeightParams *)puVar7,local_130,
                                         local_190,&local_188,
                                         (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168);
                              std::__cxx11::string::~string((string *)&local_168);
                              std::__cxx11::string::~string((string *)&local_188);
                              bVar3 = Result::good(__return_storage_ptr__);
                              if (bVar3) {
                                std::__cxx11::string::~string((string *)this_00);
                                puVar7 = (undefined1 *)local_148->forgetgaterecursionmatrix_;
                                if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                  puVar7 = Specification::_WeightParams_default_instance_;
                                }
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_188,"Bidirectional LSTM",&local_191);
                                pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_168,
                                           "backward forget gate recursion matrix",&local_192);
                                validateGeneralWeightParams
                                          (__return_storage_ptr__,(WeightParams *)puVar7,local_130,
                                           local_190,&local_188,
                                           (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_168
                                          );
                                std::__cxx11::string::~string((string *)&local_168);
                                std::__cxx11::string::~string((string *)&local_188);
                                bVar3 = Result::good(__return_storage_ptr__);
                                if (bVar3) {
                                  std::__cxx11::string::~string((string *)this_00);
                                  puVar7 = (undefined1 *)local_148->blockinputrecursionmatrix_;
                                  if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                    puVar7 = Specification::_WeightParams_default_instance_;
                                  }
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_188,"Bidirectional LSTM",&local_191);
                                  pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_168,
                                             "backward block input gate recursion matrix",&local_192
                                            );
                                  validateGeneralWeightParams
                                            (__return_storage_ptr__,(WeightParams *)puVar7,local_130
                                             ,local_190,&local_188,
                                             (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                             &local_168);
                                  std::__cxx11::string::~string((string *)&local_168);
                                  std::__cxx11::string::~string((string *)&local_188);
                                  bVar3 = Result::good(__return_storage_ptr__);
                                  if (bVar3) {
                                    std::__cxx11::string::~string((string *)this_00);
                                    puVar7 = (undefined1 *)local_148->outputgaterecursionmatrix_;
                                    if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                      puVar7 = Specification::_WeightParams_default_instance_;
                                    }
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_188,"Bidirectional LSTM",&local_191)
                                    ;
                                    pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_168,
                                               "backward output gate recursion matrix",&local_192);
                                    validateGeneralWeightParams
                                              (__return_storage_ptr__,(WeightParams *)puVar7,
                                               local_130,local_190,&local_188,
                                               (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                               &local_168);
                                    std::__cxx11::string::~string((string *)&local_168);
                                    std::__cxx11::string::~string((string *)&local_188);
                                    bVar3 = Result::good(__return_storage_ptr__);
                                    if (bVar3) {
                                      std::__cxx11::string::~string((string *)this_00);
                                      pLVar4 = recurrent.params_;
                                      if (recurrent.params_ == (LSTMParams *)0x0) {
                                        pLVar4 = (LSTMParams *)
                                                 Specification::_LSTMParams_default_instance_;
                                      }
                                      if (pLVar4->hasbiasvectors_ == true) {
                                        puVar7 = (undefined1 *)local_140->inputgatebiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward input gate bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_140->forgetgatebiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward forget gate bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_140->blockinputbiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward block input bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_140->outputgatebiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward output gate bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->inputgatebiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward input gate bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->forgetgatebiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward forget gate bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->blockinputbiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward block input bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->outputgatebiasvector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward output gate bias vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                      }
                                      if (recurrent.params_ == (LSTMParams *)0x0) {
                                        recurrent.params_ =
                                             (LSTMParams *)
                                             Specification::_LSTMParams_default_instance_;
                                      }
                                      if ((recurrent.params_)->haspeepholevectors_ == true) {
                                        puVar7 = (undefined1 *)local_140->inputgatepeepholevector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward input gate peephole vector",&local_192);
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_140->forgetgatepeepholevector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward forget gate peephole vector",&local_192)
                                        ;
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_140->outputgatepeepholevector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "forward output gate peephole vector",&local_192)
                                        ;
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->inputgatepeepholevector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward input gate peephole vector",&local_192)
                                        ;
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->forgetgatepeepholevector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward forget gate peephole vector",&local_192
                                                  );
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                        puVar7 = (undefined1 *)local_148->outputgatepeepholevector_;
                                        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
                                          puVar7 = Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_188,"Bidirectional LSTM",
                                                   &local_191);
                                        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_168,
                                                   "backward output gate peephole vector",&local_192
                                                  );
                                        validateGeneralWeightParams
                                                  (__return_storage_ptr__,(WeightParams *)puVar7,
                                                   local_190,1,&local_188,
                                                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),
                                                   &local_168);
                                        std::__cxx11::string::~string((string *)&local_168);
                                        std::__cxx11::string::~string((string *)&local_188);
                                        bVar3 = Result::good(__return_storage_ptr__);
                                        if (!bVar3) goto LAB_002a985b;
                                        std::__cxx11::string::~string((string *)this_00);
                                      }
                                      Result::Result(__return_storage_ptr__);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_002a985b;
    }
    std::operator+(&local_168,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_188,&local_168," backward lstm must provide 3 activations");
  }
  else {
    std::operator+(&local_168,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_188,&local_168," forward lstm must provide 3 activations");
  }
  std::__cxx11::string::operator=((string *)&err,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_002a985b:
  std::__cxx11::string::~string((string *)&err);
  Specification::LSTMParams::~LSTMParams(&lstmParams);
  Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams(&recurrent);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 5));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 5, 5));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate weight matrix"));

    // Check forward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix"));
    // Check backward weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate weight matrix"));

    // Check backward recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                                                  "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward block input bias vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "forward output gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward input gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                                                      "Bidirectional LSTM", layer.name(), "backward output gate peephole vector"));
    }
    return Result();
}